

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

char * CaptureDecimalInteger(char *szDataPtr,char *szDataEnd,PDWORD PtrValue)

{
  bool bVar1;
  uint local_2c;
  DWORD AddValue;
  DWORD TotalValue;
  PDWORD PtrValue_local;
  char *szDataEnd_local;
  char *szDataPtr_local;
  
  local_2c = 0;
  szDataEnd_local = szDataPtr;
  while( true ) {
    bVar1 = false;
    if (szDataEnd_local < szDataEnd) {
      bVar1 = *szDataEnd_local == ' ';
    }
    if (!bVar1) break;
    szDataEnd_local = szDataEnd_local + 1;
  }
  while( true ) {
    bVar1 = false;
    if (szDataEnd_local < szDataEnd) {
      bVar1 = *szDataEnd_local != ' ';
    }
    if (!bVar1) {
      *PtrValue = local_2c;
      return szDataEnd_local;
    }
    bVar1 = IsCharDigit(*szDataEnd_local);
    if (!bVar1) {
      return (char *)0x0;
    }
    if (local_2c + *szDataEnd_local + -0x30 < local_2c) break;
    local_2c = local_2c * 10 + *szDataEnd_local + -0x30;
    szDataEnd_local = szDataEnd_local + 1;
  }
  return (char *)0x0;
}

Assistant:

static const char * CaptureDecimalInteger(const char * szDataPtr, const char * szDataEnd, PDWORD PtrValue)
{
    DWORD TotalValue = 0;
    DWORD AddValue = 0;

    // Skip all spaces
    while (szDataPtr < szDataEnd && szDataPtr[0] == ' ')
        szDataPtr++;

    // Load the number
    while (szDataPtr < szDataEnd && szDataPtr[0] != ' ')
    {
        // Must only contain decimal digits ('0' - '9')
        if (!IsCharDigit(szDataPtr[0]))
            return NULL;

        // Get the next value and verify overflow
        AddValue = szDataPtr[0] - '0';
        if ((TotalValue + AddValue) < TotalValue)
            return NULL;

        TotalValue = (TotalValue * 10) + AddValue;
        szDataPtr++;
    }

    // Give the result
    PtrValue[0] = TotalValue;
    return szDataPtr;
}